

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BVSparseNode * __thiscall
BVSparse<Memory::HeapAllocator>::Allocate
          (BVSparse<Memory::HeapAllocator> *this,BVIndex searchIndex,BVSparseNode *nextNode)

{
  HeapAllocator *alloc;
  BVSparseNode *pBVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&BVSparseNode<Memory::HeapAllocator>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_85ac87;
  data.filename._0_4_ = 0x157;
  alloc = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  pBVar1 = (BVSparseNode *)new<Memory::HeapAllocator>(0x18,alloc,0x2f6726);
  pBVar1->next = nextNode;
  pBVar1->startIndex = searchIndex;
  (pBVar1->data).word = 0;
  return pBVar1;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::Allocate(const BVIndex searchIndex, BVSparseNode *nextNode)
{
    return AllocatorNew(TAllocator, this->alloc, BVSparseNode, searchIndex, nextNode);
}